

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O2

void opj_tcd_destroy(opj_tcd_t *tcd)

{
  uint uVar1;
  opj_tcd_tile_t *poVar2;
  opj_tcd_tilecomp_t *poVar3;
  uint uVar4;
  opj_tcd_band_t *poVar5;
  int iVar6;
  opj_tcd_resolution_t *poVar7;
  uint uVar8;
  opj_tcd_image_t *ptr;
  code *pcVar9;
  opj_tcd_precinct_t *poVar10;
  int iVar11;
  ulong uVar12;
  
  if (tcd != (opj_tcd_t *)0x0) {
    ptr = tcd->tcd_image;
    if (ptr != (opj_tcd_image_t *)0x0) {
      pcVar9 = opj_tcd_code_block_dec_deallocate;
      if ((tcd->field_0x3c & 1) == 0) {
        pcVar9 = opj_tcd_code_block_enc_deallocate;
      }
      poVar2 = ptr->tiles;
      if (poVar2 != (opj_tcd_tile_t *)0x0) {
        poVar3 = poVar2->comps;
        for (uVar4 = 0; uVar4 < poVar2->numcomps; uVar4 = uVar4 + 1) {
          poVar7 = poVar3->resolutions;
          if (poVar7 != (opj_tcd_resolution_t *)0x0) {
            uVar1 = poVar3->resolutions_size;
            for (uVar8 = 0; uVar8 != uVar1 / 0xc0; uVar8 = uVar8 + 1) {
              poVar5 = poVar7->bands;
              for (iVar6 = 0; iVar6 != 3; iVar6 = iVar6 + 1) {
                poVar10 = poVar5->precincts;
                if (poVar10 != (opj_tcd_precinct_t *)0x0) {
                  uVar12 = (ulong)poVar5->precincts_data_size / 0x38;
                  while (iVar11 = (int)uVar12, uVar12 = (ulong)(iVar11 - 1), iVar11 != 0) {
                    opj_tgt_destroy(poVar10->incltree);
                    poVar10->incltree = (opj_tgt_tree_t *)0x0;
                    opj_tgt_destroy(poVar10->imsbtree);
                    poVar10->imsbtree = (opj_tgt_tree_t *)0x0;
                    (*pcVar9)(poVar10);
                    poVar10 = poVar10 + 1;
                  }
                  opj_free(poVar5->precincts);
                  poVar5->precincts = (opj_tcd_precinct_t *)0x0;
                }
                poVar5 = poVar5 + 1;
              }
              poVar7 = poVar7 + 1;
            }
            opj_free(poVar3->resolutions);
            poVar3->resolutions = (opj_tcd_resolution_t *)0x0;
          }
          if ((poVar3->ownsData != 0) && (poVar3->data != (OPJ_INT32 *)0x0)) {
            opj_image_data_free(poVar3->data);
            poVar3->data = (OPJ_INT32 *)0x0;
            poVar3->ownsData = 0;
            poVar3->data_size_needed = 0;
            poVar3->data_size = 0;
          }
          opj_image_data_free(poVar3->data_win);
          poVar3 = poVar3 + 1;
        }
        opj_free(poVar2->comps);
        poVar2->comps = (opj_tcd_tilecomp_t *)0x0;
        opj_free(tcd->tcd_image->tiles);
        ptr = tcd->tcd_image;
        ptr->tiles = (opj_tcd_tile_t *)0x0;
      }
      opj_free(ptr);
      tcd->tcd_image = (opj_tcd_image_t *)0x0;
    }
    opj_free(tcd->used_component);
    opj_free(tcd);
    return;
  }
  return;
}

Assistant:

void opj_tcd_destroy(opj_tcd_t *tcd)
{
    if (tcd) {
        opj_tcd_free_tile(tcd);

        if (tcd->tcd_image) {
            opj_free(tcd->tcd_image);
            tcd->tcd_image = 00;
        }

        opj_free(tcd->used_component);

        opj_free(tcd);
    }
}